

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

int __thiscall rlottie::internal::model::Layer::timeRemap(Layer *this,int frameNo)

{
  bool bVar1;
  int iVar2;
  pointer pEVar3;
  long lVar4;
  int in_ESI;
  Layer *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
                      *)0x166770);
  if (bVar1) {
    pEVar3 = std::
             unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
             ::operator->((unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
                           *)0x166784);
    bVar1 = Property<float,_void>::isStatic(&pEVar3->mTimeRemap);
    if (!bVar1) {
      std::
      unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
      ::operator->((unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
                    *)0x1667c4);
      std::
      unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
      ::operator->((unique_ptr<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
                    *)0x1667da);
      Property<float,_void>::value
                ((Property<float,_void> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (int)((ulong)in_RDI >> 0x20));
      lVar4 = Composition::frameAtTime
                        ((Composition *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(double)in_RDI);
      in_ESI = (int)lVar4;
      goto LAB_001667fb;
    }
  }
  iVar2 = startFrame(in_RDI);
  in_ESI = in_ESI - iVar2;
LAB_001667fb:
  return (int)((float)in_ESI / in_RDI->mTimeStreatch);
}

Assistant:

inline int Layer::timeRemap(int frameNo) const
{
    /*
     * only consider startFrame() when there is no timeRemap.
     * when a layer has timeremap bodymovin updates the startFrame()
     * of all child layer so we don't have to take care of it.
     */
    if (!mExtra || mExtra->mTimeRemap.isStatic())
        frameNo = frameNo - startFrame();
    else
        frameNo =
            mExtra->mCompRef->frameAtTime(mExtra->mTimeRemap.value(frameNo));
    /* Apply time streatch if it has any.
     * Time streatch is just a factor by which the animation will speedup or
     * slow down with respect to the overal animation. Time streach factor is
     * already applied to the layers inFrame and outFrame.
     * @TODO need to find out if timestreatch also affects the in and out frame
     * of the child layers or not. */
    return int(frameNo / mTimeStreatch);
}